

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAtomTypesSectionParser.cpp
# Opt level: O2

void __thiscall
OpenMD::EAMAtomTypesSectionParser::parseEAMArray
          (EAMAtomTypesSectionParser *this,istream *input,
          vector<double,_std::allocator<double>_> *array,int num)

{
  int iVar1;
  long *plVar2;
  int iVar3;
  bool bVar4;
  allocator<char> aStack_100de;
  allocator<char> aStack_100dd;
  int iStack_100dc;
  istream *piStack_100d8;
  string sStack_100d0;
  string sStack_100b0;
  StringTokenizer tokenizer;
  char buffer [65535];
  
  iVar3 = 0;
  iStack_100dc = num / 5;
  if (num / 5 < 1) {
    iStack_100dc = iVar3;
  }
  piStack_100d8 = input;
  while( true ) {
    if (iVar3 == iStack_100dc) {
      return;
    }
    plVar2 = (long *)std::istream::getline((char *)piStack_100d8,(long)buffer);
    if ((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) != 0) break;
    std::__cxx11::string::string<std::allocator<char>>((string *)&sStack_100d0,buffer,&aStack_100dd)
    ;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_100b0," ;\t\n\r",&aStack_100de);
    StringTokenizer::StringTokenizer(&tokenizer,&sStack_100d0,&sStack_100b0);
    std::__cxx11::string::~string((string *)&sStack_100b0);
    std::__cxx11::string::~string((string *)&sStack_100d0);
    iVar1 = StringTokenizer::countTokens(&tokenizer);
    if (iVar1 < 5) {
      builtin_strncpy(painCave.errMsg,"EAMAtomTypesSectionParser Error: Not enough tokens\n",0x34);
      painCave.isFatal = 1;
      simError();
    }
    else {
      iVar1 = 5;
      while (bVar4 = iVar1 != 0, iVar1 = iVar1 + -1, bVar4) {
        sStack_100d0._M_dataplus._M_p = (pointer)StringTokenizer::nextTokenAsDouble(&tokenizer);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  (array,(double *)&sStack_100d0);
      }
    }
    iVar3 = iVar3 + 1;
    StringTokenizer::~StringTokenizer(&tokenizer);
  }
  builtin_strncpy(painCave.errMsg + 0x30,"s to read\n",0xb);
  builtin_strncpy(painCave.errMsg + 0x20," Not enough line",0x10);
  builtin_strncpy(painCave.errMsg + 0x10,"ionParser Error:",0x10);
  builtin_strncpy(painCave.errMsg,"EAMAtomTypesSect",0x10);
  painCave.isFatal = 1;
  simError();
  return;
}

Assistant:

void EAMAtomTypesSectionParser::parseEAMArray(istream& input,
                                                std::vector<RealType>& array,
                                                int num) {
    const int dataPerLine = 5;
    if (num % dataPerLine != 0) {}

    int nlinesToRead = num / dataPerLine;

    const int bufferSize = 65535;
    char buffer[bufferSize];
    int lineCount = 0;

    while (lineCount < nlinesToRead && input.getline(buffer, bufferSize)) {
      StringTokenizer tokenizer(buffer);
      if (tokenizer.countTokens() >= dataPerLine) {
        for (int i = 0; i < dataPerLine; ++i) {
          array.push_back(tokenizer.nextTokenAsDouble());
        }
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "EAMAtomTypesSectionParser Error: "
                 "Not enough tokens\n");
        painCave.isFatal = 1;
        simError();
      }
      ++lineCount;
    }

    if (lineCount < nlinesToRead) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "EAMAtomTypesSectionParser Error: "
               "Not enough lines to read\n");
      painCave.isFatal = 1;
      simError();
    }
  }